

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_bfins_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *s_00;
  TCGv_i32 arg1;
  byte bVar1;
  uint32_t uVar2;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGTemp *a3;
  uintptr_t o_1;
  uintptr_t o_3;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  uint uVar3;
  uintptr_t o_4;
  TCGv_i32 arg2;
  uint uVar4;
  uint uVar5;
  uintptr_t o_6;
  uintptr_t o_2;
  TCGv_i32 pTVar6;
  uintptr_t o;
  
  s_00 = s->uc->tcg_ctx;
  uVar2 = cpu_lduw_code_m68k(env,s->pc);
  s->pc = s->pc + 2;
  pTVar6 = s_00->cpu_dregs[insn & 7];
  arg1 = *(TCGv_i32 *)((long)s_00->cpu_dregs + (ulong)(uVar2 >> 9 & 0x38));
  uVar4 = uVar2 - 1 & 0x1f;
  a1 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)a1 - (long)s_00);
  if ((uVar2 & 0x20) == 0) {
    tcg_gen_shli_i32_m68k(s_00,QREG_CC_N,arg1,uVar4 ^ 0x1f);
  }
  else {
    tcg_gen_op2_m68k(s_00,INDEX_op_neg_i32,(TCGArg)a1,
                     (TCGArg)((long)&s_00->pool_cur + (long)s_00->cpu_dregs[uVar2 & 7]));
    tcg_gen_andi_i32_m68k(s_00,ret,ret,0x1f);
    tcg_gen_op3_m68k(s_00,INDEX_op_shl_i32,(TCGArg)(QREG_CC_N + (long)s_00),
                     (TCGArg)(arg1 + (long)&s_00->pool_cur),(TCGArg)a1);
  }
  uVar5 = uVar2 >> 6 & 0x1f;
  set_cc_op(s,CC_OP_LOGIC);
  if ((uVar2 & 0x820) == 0) {
    uVar5 = uVar4 + uVar5 + 1;
    if (uVar5 < 0x21) {
      tcg_gen_deposit_i32_m68k(s_00,pTVar6,pTVar6,arg1,0x20 - uVar5,uVar4 + 1);
    }
    else {
      uVar4 = -2 << (sbyte)uVar4;
      tcg_gen_andi_i32_m68k(s_00,ret,arg1,~uVar4);
      tcg_gen_rotri_i32_m68k(s_00,ret,ret,uVar5 & 0x1f);
      bVar1 = (byte)uVar5 & 0x1f;
      tcg_gen_andi_i32_m68k(s_00,pTVar6,pTVar6,uVar4 >> bVar1 | uVar4 << 0x20 - bVar1);
      tcg_gen_op3_m68k(s_00,INDEX_op_or_i32,(TCGArg)(pTVar6 + (long)s_00),
                       (TCGArg)(pTVar6 + (long)s_00),(TCGArg)a1);
    }
  }
  else {
    a1_00 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
    arg2 = (TCGv_i32)((long)a1_00 - (long)s_00);
    a3 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
    ret_00 = (TCGv_i32)((long)a3 - (long)s_00);
    if ((uVar2 & 0x20) == 0) {
      uVar3 = -2 << (sbyte)uVar4;
      tcg_gen_andi_i32_m68k(s_00,ret,arg1,~uVar3);
      tcg_gen_op2_m68k(s_00,INDEX_op_movi_i32,(TCGArg)a1_00,(long)(int)uVar3);
      tcg_gen_op2_m68k(s_00,INDEX_op_movi_i32,(TCGArg)a3,(ulong)(uVar4 + 1 & 0x1f));
    }
    else {
      tcg_gen_subi_i32_m68k(s_00,ret_00,s_00->cpu_dregs[uVar2 & 7],1);
      tcg_gen_andi_i32_m68k(s_00,ret_00,ret_00,0x1f);
      tcg_gen_op2_m68k(s_00,INDEX_op_movi_i32,(TCGArg)a1_00,0xfffffffffffffffe);
      tcg_gen_op3_m68k(s_00,INDEX_op_shl_i32,(TCGArg)a1_00,(TCGArg)a1_00,(TCGArg)a3);
      if (s_00->cpu_dregs[uVar2 & 7] != ret_00) {
        tcg_gen_op2_m68k(s_00,INDEX_op_mov_i32,(TCGArg)a3,
                         (TCGArg)(s_00->cpu_dregs[uVar2 & 7] + (long)s_00));
      }
      tcg_gen_andc_i32_m68k(s_00,ret,arg1,arg2);
    }
    if ((uVar2 >> 0xb & 1) == 0) {
      tcg_gen_addi_i32_m68k(s_00,ret_00,ret_00,uVar5);
    }
    else {
      tcg_gen_op3_m68k(s_00,INDEX_op_add_i32,(TCGArg)a3,(TCGArg)a3,
                       (TCGArg)((long)&s_00->pool_cur + (long)s_00->cpu_dregs[uVar2 >> 6 & 7]));
    }
    tcg_gen_andi_i32_m68k(s_00,ret_00,ret_00,0x1f);
    tcg_gen_rotr_i32_m68k(s_00,arg2,arg2,ret_00);
    tcg_gen_rotr_i32_m68k(s_00,ret,ret,ret_00);
    pTVar6 = pTVar6 + (long)s_00;
    tcg_gen_op3_m68k(s_00,INDEX_op_and_i32,(TCGArg)pTVar6,(TCGArg)pTVar6,(TCGArg)a1_00);
    tcg_gen_op3_m68k(s_00,INDEX_op_or_i32,(TCGArg)pTVar6,(TCGArg)pTVar6,(TCGArg)a1);
    tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret_00 + (long)s_00));
    tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(arg2 + (long)s_00));
  }
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret + (long)s_00));
  return;
}

Assistant:

DISAS_INSN(bfins_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int ext = read_im16(env, s);
    TCGv dst = DREG(insn, 0);
    TCGv src = DREG(ext, 12);
    int len = ((extract32(ext, 0, 5) - 1) & 31) + 1;
    int ofs = extract32(ext, 6, 5);  /* big bit-endian */
    int pos = 32 - ofs - len;        /* little bit-endian */
    TCGv tmp;

    tmp = tcg_temp_new(tcg_ctx);

    if (ext & 0x20) {
        /* Variable width */
        tcg_gen_neg_i32(tcg_ctx, tmp, DREG(ext, 0));
        tcg_gen_andi_i32(tcg_ctx, tmp, tmp, 31);
        tcg_gen_shl_i32(tcg_ctx, QREG_CC_N, src, tmp);
    } else {
        /* Immediate width */
        tcg_gen_shli_i32(tcg_ctx, QREG_CC_N, src, 32 - len);
    }
    set_cc_op(s, CC_OP_LOGIC);

    /* Immediate width and offset */
    if ((ext & 0x820) == 0) {
        /* Check for suitability for deposit.  */
        if (pos >= 0) {
            tcg_gen_deposit_i32(tcg_ctx, dst, dst, src, pos, len);
        } else {
#ifdef _MSC_VER
            uint32_t maski = 0xfffffffeU << (len - 1);
#else
            uint32_t maski = -2U << (len - 1);
#endif
            uint32_t roti = (ofs + len) & 31;
            tcg_gen_andi_i32(tcg_ctx, tmp, src, ~maski);
            tcg_gen_rotri_i32(tcg_ctx, tmp, tmp, roti);
            tcg_gen_andi_i32(tcg_ctx, dst, dst, ror32(maski, roti));
            tcg_gen_or_i32(tcg_ctx, dst, dst, tmp);
        }
    } else {
        TCGv mask = tcg_temp_new(tcg_ctx);
        TCGv rot = tcg_temp_new(tcg_ctx);

        if (ext & 0x20) {
            /* Variable width */
            tcg_gen_subi_i32(tcg_ctx, rot, DREG(ext, 0), 1);
            tcg_gen_andi_i32(tcg_ctx, rot, rot, 31);
            tcg_gen_movi_i32(tcg_ctx, mask, -2);
            tcg_gen_shl_i32(tcg_ctx, mask, mask, rot);
            tcg_gen_mov_i32(tcg_ctx, rot, DREG(ext, 0));
            tcg_gen_andc_i32(tcg_ctx, tmp, src, mask);
        } else {
            /* Immediate width (variable offset) */
#ifdef _MSC_VER
            uint32_t maski = 0xfffffffeU << (len - 1);
#else
            uint32_t maski = -2U << (len - 1);
#endif
            tcg_gen_andi_i32(tcg_ctx, tmp, src, ~maski);
            tcg_gen_movi_i32(tcg_ctx, mask, maski);
            tcg_gen_movi_i32(tcg_ctx, rot, len & 31);
        }
        if (ext & 0x800) {
            /* Variable offset */
            tcg_gen_add_i32(tcg_ctx, rot, rot, DREG(ext, 6));
        } else {
            /* Immediate offset (variable width) */
            tcg_gen_addi_i32(tcg_ctx, rot, rot, ofs);
        }
        tcg_gen_andi_i32(tcg_ctx, rot, rot, 31);
        tcg_gen_rotr_i32(tcg_ctx, mask, mask, rot);
        tcg_gen_rotr_i32(tcg_ctx, tmp, tmp, rot);
        tcg_gen_and_i32(tcg_ctx, dst, dst, mask);
        tcg_gen_or_i32(tcg_ctx, dst, dst, tmp);

        tcg_temp_free(tcg_ctx, rot);
        tcg_temp_free(tcg_ctx, mask);
    }
    tcg_temp_free(tcg_ctx, tmp);
}